

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int SetAllPWMsFromThreadSSC32x(SSC32 *pSSC32,int *selectedchannels,int *pws)

{
  int iVar1;
  int local_2c;
  int res;
  int id;
  int *pws_local;
  int *selectedchannels_local;
  SSC32 *pSSC32_local;
  
  local_2c = 0;
  do {
    if ((SSC32 *)addrsSSC32[local_2c] == pSSC32) {
      EnterCriticalSection(SSC32CS + local_2c);
      memcpy(selectedchannelsSSC32 + local_2c,selectedchannels,0x80);
      memcpy(pwsSSC32 + local_2c,pws,0x80);
      iVar1 = resSSC32[local_2c];
      LeaveCriticalSection(SSC32CS + local_2c);
      return iVar1;
    }
    local_2c = local_2c + 1;
  } while (local_2c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int SetAllPWMsFromThreadSSC32x(SSC32* pSSC32, int* selectedchannels, int* pws)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSSC32[id] != pSSC32)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&SSC32CS[id]);
	memcpy(selectedchannelsSSC32[id], selectedchannels, NB_CHANNELS_PWM_SSC32*sizeof(int));
	memcpy(pwsSSC32[id], pws, NB_CHANNELS_PWM_SSC32*sizeof(int));
	res = resSSC32[id];
	LeaveCriticalSection(&SSC32CS[id]);

	return res;
}